

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O0

void int_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                   JSAMPARRAY output_data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long local_78;
  INT32 outvalue;
  JSAMPROW outptr;
  JSAMPROW inptr;
  uint local_58;
  JDIMENSION output_cols;
  JDIMENSION outcol_h;
  JDIMENSION outcol;
  int v;
  int h;
  int numpix2;
  int numpix;
  int v_expand;
  int h_expand;
  int outrow;
  int inrow;
  my_downsample_ptr downsample;
  JSAMPARRAY output_data_local;
  JSAMPARRAY input_data_local;
  jpeg_component_info *compptr_local;
  j_compress_ptr cinfo_local;
  
  uVar1 = compptr->width_in_blocks * compptr->DCT_h_scaled_size;
  uVar2 = (uint)*(byte *)((long)&cinfo->downsample[6].start_pass + (long)compptr->component_index);
  uVar3 = (uint)*(byte *)((long)&cinfo->downsample[6].downsample +
                         (long)compptr->component_index + 2);
  expand_right_edge(input_data,cinfo->max_v_samp_factor,cinfo->image_width,uVar1 * uVar2);
  v_expand = 0;
  for (h_expand = 0; h_expand < cinfo->max_v_samp_factor; h_expand = uVar3 + h_expand) {
    local_58 = 0;
    outvalue = (INT32)output_data[v_expand];
    for (output_cols = 0; output_cols < uVar1; output_cols = output_cols + 1) {
      local_78 = 0;
      for (outcol_h = 0; (int)outcol_h < (int)uVar3; outcol_h = outcol_h + 1) {
        outptr = input_data[(int)(h_expand + outcol_h)] + local_58;
        for (outcol = 0; (int)outcol < (int)uVar2; outcol = outcol + 1) {
          local_78 = (int)(uint)*outptr + local_78;
          outptr = outptr + 1;
        }
      }
      *(char *)outvalue =
           (char)((local_78 + (int)((uVar2 * uVar3) / 2)) / (long)(int)(uVar2 * uVar3));
      local_58 = uVar2 + local_58;
      outvalue = outvalue + 1;
    }
    v_expand = v_expand + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
int_downsample (j_compress_ptr cinfo, jpeg_component_info * compptr,
		JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  my_downsample_ptr downsample = (my_downsample_ptr) cinfo->downsample;
  int inrow, outrow, h_expand, v_expand, numpix, numpix2, h, v;
  JDIMENSION outcol, outcol_h;	/* outcol_h == outcol*h_expand */
  JDIMENSION output_cols = compptr->width_in_blocks * compptr->DCT_h_scaled_size;
  JSAMPROW inptr, outptr;
  INT32 outvalue;

  h_expand = downsample->h_expand[compptr->component_index];
  v_expand = downsample->v_expand[compptr->component_index];
  numpix = h_expand * v_expand;
  numpix2 = numpix/2;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data, cinfo->max_v_samp_factor,
		    cinfo->image_width, output_cols * h_expand);

  inrow = outrow = 0;
  while (inrow < cinfo->max_v_samp_factor) {
    outptr = output_data[outrow];
    for (outcol = 0, outcol_h = 0; outcol < output_cols;
	 outcol++, outcol_h += h_expand) {
      outvalue = 0;
      for (v = 0; v < v_expand; v++) {
	inptr = input_data[inrow+v] + outcol_h;
	for (h = 0; h < h_expand; h++) {
	  outvalue += (INT32) GETJSAMPLE(*inptr++);
	}
      }
      *outptr++ = (JSAMPLE) ((outvalue + numpix2) / numpix);
    }
    inrow += v_expand;
    outrow++;
  }
}